

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

void __thiscall cfd::core::SchnorrSignature::SchnorrSignature(SchnorrSignature *this,ByteData *data)

{
  byte flag;
  pointer puVar1;
  size_t sVar2;
  CfdException *pCVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&data->data_);
  SigHashType::SigHashType(&this->sighash_type_,kSigHashDefault,false,false);
  sVar2 = ByteData::GetDataSize(&this->data_);
  if (sVar2 == 0x41) {
    ByteData::GetBytes(&local_40,data);
    flag = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[0x40];
    if (flag == 0) {
LAB_00365495:
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid Schnorr signature hash type.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_68);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((char)flag < '\0') {
      if (0x83 < flag) goto LAB_00365495;
    }
    else if ('\x03' < (char)flag) goto LAB_00365495;
    SigHashType::SetFromSigHashFlag(&this->sighash_type_,flag);
    ByteData::ByteData((ByteData *)&local_68,
                       local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x40);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_68._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar2 = ByteData::GetDataSize(&this->data_);
    if (sVar2 != 0x40) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid Schnorr signature data.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_68);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

SchnorrSignature::SchnorrSignature(const ByteData &data)
    : data_(data), sighash_type_(SigHashAlgorithm::kSigHashDefault) {
  if (data_.GetDataSize() == SchnorrSignature::kSchnorrSignatureSize + 1) {
    auto bytes = data.GetBytes();
    uint8_t sighash_type = bytes[SchnorrSignature::kSchnorrSignatureSize];
    if ((sighash_type == 0) || (!IsValidSigHashType(sighash_type))) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr signature hash type.");
    }
    sighash_type_.SetFromSigHashFlag(sighash_type);
    data_ = ByteData(bytes.data(), SchnorrSignature::kSchnorrSignatureSize);
  } else if (data_.GetDataSize() != SchnorrSignature::kSchnorrSignatureSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Schnorr signature data.");
  }
}